

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

JointObservation * __thiscall
TransitionObservationIndependentMADPDiscrete::GetJointObservation
          (TransitionObservationIndependentMADPDiscrete *this,Index i)

{
  const_reference ppJVar1;
  iterator iVar2;
  value_type this_00;
  ulong uVar3;
  ObservationDiscrete *a;
  uint agentI;
  ulong uVar4;
  Index i_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ind_sI;
  pair<unsigned_int,_JointObservationDiscrete_*> local_30;
  
  i_local = i;
  if (this->_m_jointIndicesCached == true) {
    ppJVar1 = std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::
              at(&this->_m_jointObs,(ulong)i);
    this_00 = *ppJVar1;
  }
  else {
    iVar2 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_JointObservationDiscrete_*>,_std::_Select1st<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
            ::find(&this->_m_jointObsMap->_M_t,&i_local);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->_m_jointObsMap->_M_t)._M_impl.super__Rb_tree_header) {
      this_00 = (value_type)operator_new(0x48);
      JointObservationDiscrete::JointObservationDiscrete(this_00,i_local);
      IndexTools::JointToIndividualIndices(&ind_sI,i_local,&this->_m_nrIndivObs);
      agentI = 0;
      while( true ) {
        uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
        uVar4 = (ulong)agentI;
        if (uVar3 <= uVar4) break;
        a = MADPComponentDiscreteObservations::GetObservationDiscrete
                      (&(this->_m_individualMADPDs).
                        super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar4]->_m_O,0,
                       ind_sI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar4]);
        JointObservationDiscrete::AddIndividualObservation(this_00,a,agentI);
        agentI = agentI + 1;
      }
      local_30.first = i_local;
      local_30.second = this_00;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,JointObservationDiscrete*>,std::_Select1st<std::pair<unsigned_int_const,JointObservationDiscrete*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,JointObservationDiscrete*>>>
      ::_M_emplace_unique<std::pair<unsigned_int,JointObservationDiscrete*>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,JointObservationDiscrete*>,std::_Select1st<std::pair<unsigned_int_const,JointObservationDiscrete*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,JointObservationDiscrete*>>>
                  *)this->_m_jointObsMap,&local_30);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&ind_sI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    else {
      iVar2 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_JointObservationDiscrete_*>,_std::_Select1st<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
              ::find(&this->_m_jointObsMap->_M_t,&i_local);
      this_00 = (value_type)iVar2._M_node[1]._M_parent;
    }
  }
  return &this_00->super_JointObservation;
}

Assistant:

const JointObservation* 
TransitionObservationIndependentMADPDiscrete::GetJointObservation(Index i) const
{
    if(_m_jointIndicesCached) // we cached all joint obs
        return(_m_jointObs.at(i));
    // we cached the ones already asked for
    else if(_m_jointObsMap->find(i)!=_m_jointObsMap->end())
        return(_m_jointObsMap->find(i)->second);
    else // create new joint obs and add it to cache
    {
        JointObservationDiscrete *observation=new JointObservationDiscrete(i);
        vector<Index> ind_sI=
            IndexTools::JointToIndividualIndices(i,_m_nrIndivObs);
        for(Index agI = 0; agI < GetNrAgents(); agI++)
            observation->AddIndividualObservation(
                GetIndividualMADPD(agI)->GetObservationDiscrete(0,ind_sI[agI]),
                agI);
        
        _m_jointObsMap->insert(make_pair(i,observation));
        return(observation);
    }
}